

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O1

double calc_mean_only_weighted<float,unsigned_long,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,unsigned_long *Xc_ind
                 ,unsigned_long *Xc_indptr,vector<double,_std::allocator<double>_> *w)

{
  ulong *puVar1;
  unsigned_long uVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  unsigned_long uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  uVar10 = Xc_indptr[col_num];
  uVar2 = Xc_indptr[col_num + 1];
  dVar11 = 0.0;
  if (uVar10 != uVar2) {
    puVar3 = ix_arr + st;
    puVar5 = ix_arr + end + 1;
    uVar4 = (long)puVar5 - (long)puVar3 >> 3;
    if (0 < (long)uVar4) {
      do {
        uVar8 = uVar4 >> 1;
        uVar6 = ~uVar8 + uVar4;
        uVar4 = uVar8;
        if (puVar3[uVar8] < Xc_ind[uVar10]) {
          puVar3 = puVar3 + uVar8 + 1;
          uVar4 = uVar6;
        }
      } while (0 < (long)uVar4);
    }
    dVar12 = 0.0;
    dVar13 = 0.0;
    if (st <= end) {
      do {
        dVar13 = dVar13 + (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[ix_arr[st]];
        st = st + 1;
      } while (st <= end);
    }
    if (uVar10 == uVar2 || puVar3 == puVar5) {
      dVar14 = 0.0;
    }
    else {
      dVar14 = 0.0;
      dVar12 = 0.0;
      while (uVar4 = *puVar3, uVar4 <= Xc_ind[uVar2 - 1]) {
        puVar1 = Xc_ind + uVar10;
        uVar6 = *puVar1;
        if (uVar6 == uVar4) {
          dVar11 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar4];
          if ((uint)ABS(Xc[uVar10]) < 0x7f800000) {
            dVar12 = dVar12 + dVar11;
            dVar14 = dVar14 + (((double)Xc[uVar10] - dVar14) * dVar11) / dVar12;
          }
          else {
            dVar13 = dVar13 - dVar11;
          }
          if ((puVar3 == ix_arr + end) || (uVar10 == uVar2 - 1)) break;
          puVar9 = puVar1 + 1;
          puVar3 = puVar3 + 1;
          uVar4 = (long)((long)Xc_ind + (uVar2 * 8 - (long)puVar9)) >> 3;
          if (0 < (long)uVar4) {
            do {
              uVar8 = uVar4 >> 1;
              uVar6 = ~uVar8 + uVar4;
              uVar4 = uVar8;
              if (puVar9[uVar8] < *puVar3) {
                puVar9 = puVar9 + uVar8 + 1;
                uVar4 = uVar6;
              }
            } while (0 < (long)uVar4);
          }
LAB_002f4af7:
          uVar10 = (long)puVar9 - (long)Xc_ind >> 3;
        }
        else {
          if (uVar6 <= uVar4) {
            puVar9 = puVar1 + 1;
            uVar6 = (long)((long)Xc_ind + (uVar2 * 8 - (long)(puVar1 + 1))) >> 3;
            while (0 < (long)uVar6) {
              uVar7 = uVar6 >> 1;
              uVar8 = ~uVar7 + uVar6;
              uVar6 = uVar7;
              if (puVar9[uVar7] < uVar4) {
                puVar9 = puVar9 + uVar7 + 1;
                uVar6 = uVar8;
              }
            }
            goto LAB_002f4af7;
          }
          puVar3 = puVar3 + 1;
          uVar4 = (long)puVar5 - (long)puVar3 >> 3;
          while (0 < (long)uVar4) {
            uVar7 = uVar4 >> 1;
            uVar8 = ~uVar7 + uVar4;
            uVar4 = uVar7;
            if (puVar3[uVar7] < uVar6) {
              puVar3 = puVar3 + uVar7 + 1;
              uVar4 = uVar8;
            }
          }
        }
        if ((puVar3 == puVar5) || (uVar10 == uVar2)) break;
      }
    }
    dVar11 = 0.0;
    if ((dVar12 != 0.0) || (NAN(dVar12))) {
      dVar11 = (double)(~-(ulong)(dVar12 < dVar13) & (ulong)dVar14 |
                       (ulong)((dVar12 / dVar13) * dVar14) & -(ulong)(dVar12 < dVar13));
    }
  }
  return dVar11;
}

Assistant:

double calc_mean_only_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return 0;
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos]))) {
                cnt -= w[*row];
            }

            else {
                w_this = w[*row];
                added += w_this;
                m += w_this * (Xc[curr_pos] - m) / added;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
        return 0;

    if (cnt > added)
        m *= (ldouble_safe)added / (ldouble_safe)cnt;

    return m;
}